

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  short *psVar1;
  ImGuiItemStatusFlags *pIVar2;
  ImRect *pIVar3;
  ImVec2 IVar4;
  ImGuiNavLayer IVar5;
  ImGuiID IVar6;
  ImGuiWindow *window_00;
  ImGuiWindow *pIVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  ImGuiID id_1;
  ImGuiNavItemData *result;
  ImGuiContext *g;
  ImGuiWindow *window;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  pIVar8 = GImGui;
  window_00 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  IVar4 = bb->Max;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  (pIVar8->LastItemData).Rect.Min = bb->Min;
  (pIVar8->LastItemData).Rect.Max = IVar4;
  IVar4 = nav_bb_arg->Max;
  (pIVar8->LastItemData).NavRect.Min = nav_bb_arg->Min;
  (pIVar8->LastItemData).NavRect.Max = IVar4;
  uVar11 = pIVar8->CurrentItemFlags | extra_flags;
  (pIVar8->LastItemData).InFlags = uVar11;
  (pIVar8->LastItemData).StatusFlags = 0;
  if (id == 0) goto LAB_00134f41;
  IVar5 = (window_00->DC).NavLayerCurrent;
  psVar1 = &(window_00->DC).NavLayersActiveMaskNext;
  *psVar1 = *psVar1 | (ushort)(1 << ((byte)IVar5 & 0x1f));
  IVar6 = pIVar8->NavId;
  if ((((IVar6 != id) && (pIVar8->NavAnyRequest != true)) ||
      (pIVar7 = pIVar8->NavWindow, pIVar7->RootWindowForNav != window_00->RootWindowForNav)) ||
     ((window_00 != pIVar7 && (((uint)(pIVar7->Flags | window_00->Flags) >> 0x17 & 1) == 0))))
  goto LAB_00134f41;
  IVar4 = (pIVar8->LastItemData).NavRect.Min;
  fVar16 = IVar4.x;
  fVar17 = IVar4.y;
  IVar4 = (pIVar8->LastItemData).NavRect.Max;
  fVar18 = IVar4.x;
  fVar19 = IVar4.y;
  if ((pIVar8->NavInitRequest == true) && (pIVar8->NavLayer == IVar5)) {
    if ((uVar11 & 0x14) == 0) {
      pIVar8->NavInitResultId = id;
      fVar13 = (window_00->Pos).x;
      fVar14 = (window_00->Pos).y;
      (pIVar8->NavInitResultRectRel).Min.x = fVar16 - fVar13;
      (pIVar8->NavInitResultRectRel).Min.y = fVar17 - fVar14;
      (pIVar8->NavInitResultRectRel).Max.x = fVar18 - fVar13;
      (pIVar8->NavInitResultRectRel).Max.y = fVar19 - fVar14;
LAB_00135036:
      pIVar8->NavInitRequest = false;
      pIVar8->NavAnyRequest = pIVar8->NavMoveScoringItems;
    }
    else if (pIVar8->NavInitResultId == 0) {
      pIVar8->NavInitResultId = id;
      fVar13 = (window_00->Pos).x;
      fVar14 = (window_00->Pos).y;
      (pIVar8->NavInitResultRectRel).Min.x = fVar16 - fVar13;
      (pIVar8->NavInitResultRectRel).Min.y = fVar17 - fVar14;
      (pIVar8->NavInitResultRectRel).Max.x = fVar18 - fVar13;
      (pIVar8->NavInitResultRectRel).Max.y = fVar19 - fVar14;
      if ((uVar11 & 0x14) == 0) goto LAB_00135036;
    }
  }
  if (pIVar8->NavMoveScoringItems == true) {
    if ((uVar11 >> 8 & 1) != 0) {
      pIVar8->NavTabbingInputableRemaining = pIVar8->NavTabbingInputableRemaining + -1;
    }
    if (IVar6 == id) {
      uVar12 = pIVar8->NavMoveFlags;
      if (((byte)uVar12 >> 4 & (uVar11 & 0xc) == 0) != 0) {
LAB_00135096:
        result = &pIVar8->NavMoveResultOther;
        if (window_00 == pIVar7) {
          result = &pIVar8->NavMoveResultLocal;
        }
        if ((uVar12 >> 9 & 1) == 0) {
          bVar9 = NavScoreItem(result);
          if (bVar9) {
            NavApplyItemToResult(result);
          }
          if ((((pIVar8->NavMoveFlags & 0x20) != 0) &&
              (fVar13 = (window_00->ClipRect).Max.y, fVar17 < fVar13)) &&
             ((fVar14 = (window_00->ClipRect).Min.y, fVar14 < fVar19 &&
              ((fVar16 < (window_00->ClipRect).Max.x &&
               ((window_00->ClipRect).Min.x <= fVar18 && fVar18 != (window_00->ClipRect).Min.x))))))
          {
            fVar15 = fVar13;
            if (fVar19 <= fVar13) {
              fVar15 = fVar19;
            }
            if (fVar17 <= fVar13) {
              fVar13 = fVar17;
            }
            if ((fVar19 - fVar17) * 0.7 <=
                (float)(-(uint)(fVar19 < fVar14) & (uint)fVar14 |
                       ~-(uint)(fVar19 < fVar14) & (uint)fVar15) -
                (float)(-(uint)(fVar17 < fVar14) & (uint)fVar14 |
                       ~-(uint)(fVar17 < fVar14) & (uint)fVar13)) {
              bVar9 = NavScoreItem(&pIVar8->NavMoveResultLocalVisible);
              if (bVar9) {
                NavApplyItemToResult(&pIVar8->NavMoveResultLocalVisible);
              }
            }
          }
        }
        else if (pIVar8->NavTabbingInputableRemaining == 0) {
          NavMoveRequestResolveWithLastItem();
        }
      }
    }
    else if ((uVar11 & 0xc) == 0) {
      uVar12 = pIVar8->NavMoveFlags;
      goto LAB_00135096;
    }
  }
  if (pIVar8->NavId == id) {
    pIVar8->NavWindow = window_00;
    IVar5 = (window_00->DC).NavLayerCurrent;
    pIVar8->NavLayer = IVar5;
    pIVar8->NavFocusScopeId = (window_00->DC).NavFocusScopeIdCurrent;
    pIVar8->NavIdIsAlive = true;
    fVar13 = (window_00->Pos).x;
    fVar14 = (window_00->Pos).y;
    pIVar3 = window_00->NavRectRel + IVar5;
    (pIVar3->Min).x = fVar16 - fVar13;
    (pIVar3->Min).y = fVar17 - fVar14;
    (pIVar3->Max).x = fVar18 - fVar13;
    (pIVar3->Max).y = fVar19 - fVar14;
  }
LAB_00134f41:
  (pIVar8->NextItemData).Flags = 0;
  bVar9 = IsClippedEx(bb,id);
  if (!bVar9) {
    if (((uint)extra_flags >> 8 & 1) != 0) {
      ItemInputable(window_00,id);
    }
    bVar10 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (bVar10) {
      pIVar2 = &(pIVar8->LastItemData).StatusFlags;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
    }
  }
  return !bVar9;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem();

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // [WIP] Tab stop handling (previously was using internal FocusableItemRegister() api)
    // FIXME-NAV: We would now want to move this before the clipping test, but this would require being able to scroll and currently this would mean an extra frame. (#4079, #343)
    if (extra_flags & ImGuiItemFlags_Inputable)
        ItemInputable(window, id);

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}